

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O3

void __thiscall
InstructionInfo::generateFindInstructionNameElseIf(InstructionInfo *this,ostream *out)

{
  ostream *poVar1;
  
  generateElseIf(this,out,false);
  std::__ostream_insert<char,std::char_traits<char>>(out,"    return \"",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\";\n",3);
  return;
}

Assistant:

void InstructionInfo::generateFindInstructionNameElseIf(std::ostream& out)
{
    generateElseIf(out,false);
    out << "    return \"" << name << "\";\n";
}